

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall test_message_sizes::test_method(test_message_sizes *this)

{
  unit_test_log_t *puVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  basic_cstring<const_char> local_158;
  basic_cstring<const_char> local_148;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_138;
  undefined8 local_118;
  message_size local_10c;
  undefined4 local_105;
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_int>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_int,_unsigned_long,_void>_>
  local_100;
  assertion_result local_f0;
  basic_cstring<const_char> local_d8;
  basic_cstring<const_char> local_c8;
  basic_cstring<const_char> local_b8;
  basic_cstring<const_char> local_a8 [2];
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_88;
  undefined4 local_68;
  message_size local_64;
  undefined4 local_5d;
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_int>,_int,_boost::test_tools::assertion::op::EQ<unsigned_int,_int,_void>_>
  local_58;
  assertion_result local_50;
  basic_cstring<const_char> local_38;
  basic_cstring<const_char> local_28;
  empty_message<(message_id)1> local_11;
  test_message_sizes *ptStack_10;
  test_message msg;
  test_message_sizes *this_local;
  
  local_11 = (empty_message<(message_id)1>)0x0;
  ptStack_10 = this;
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_38);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_28,0xf7,&local_38);
    local_64 = empty_message<(message_id)1>::body_size(&local_11);
    boost::test_tools::assertion::seed::operator->*((seed *)((long)&local_5d + 1),&local_5d);
    local_68 = 0;
    boost::test_tools::assertion::
    expression_base<boost::test_tools::assertion::value_expr<unsigned_int>,unsigned_int>::operator==
              ((expression_base<boost::test_tools::assertion::value_expr<unsigned_int>,unsigned_int>
                *)&local_58,(int *)((long)&local_5d + 1));
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<unsigned_int>,_int,_boost::test_tools::assertion::op::EQ<unsigned_int,_int,_void>_>
    ::evaluate(&local_50,&local_58,false);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_a8,"msg.body_size() == 0",0x14);
    boost::unit_test::operator<<(&local_88,plVar3,local_a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
               ,0x60);
    boost::test_tools::tt_detail::report_assertion
              (&local_50,&local_88.super_lazy_ostream,&local_b8,0xf7,CHECK,CHECK_BUILT_ASSERTION,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_88);
    boost::test_tools::assertion_result::~assertion_result(&local_50);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_d8);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_c8,0xf8,&local_d8);
    local_10c = basic_message<empty_message<(message_id)1>,_(message_id)1>::size
                          ((basic_message<empty_message<(message_id)1>,_(message_id)1> *)&local_11);
    boost::test_tools::assertion::seed::operator->*((seed *)((long)&local_105 + 1),&local_105);
    local_118 = 5;
    boost::test_tools::assertion::
    expression_base<boost::test_tools::assertion::value_expr<unsigned_int>,unsigned_int>::operator==
              ((expression_base<boost::test_tools::assertion::value_expr<unsigned_int>,unsigned_int>
                *)&local_100,(unsigned_long *)((long)&local_105 + 1));
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<unsigned_int>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_int,_unsigned_long,_void>_>
    ::evaluate(&local_f0,&local_100,false);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_148,"msg.size() == sizeof(message_header)",0x24);
    boost::unit_test::operator<<(&local_138,plVar3,&local_148);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_158,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
               ,0x60);
    boost::test_tools::tt_detail::report_assertion
              (&local_f0,&local_138.super_lazy_ostream,&local_158,0xf8,CHECK,CHECK_BUILT_ASSERTION,0
              );
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_138);
    boost::test_tools::assertion_result::~assertion_result(&local_f0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_message_sizes)
{
    #pragma pack(push, 1)
    struct test_message final : public empty_message<message_id::UNDEFINED>
    {
    };
    #pragma pack(pop)

    const auto msg = test_message{};

    BOOST_TEST(msg.body_size() == 0);
    BOOST_TEST(msg.size() == sizeof(message_header));
}